

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

ProcLangConstruct GenStateGetStatementHandler(sxu32 nKeywordID)

{
  uint local_18;
  sxu32 n;
  sxu32 nKeywordID_local;
  
  local_18 = 0;
  while( true ) {
    if (0xd < local_18) {
      return (ProcLangConstruct)0x0;
    }
    if (aLangConstruct[local_18].nID == nKeywordID) break;
    local_18 = local_18 + 1;
  }
  return aLangConstruct[local_18].xConstruct;
}

Assistant:

static ProcLangConstruct GenStateGetStatementHandler(
	sxu32 nKeywordID   /* Keyword  ID*/
	)
{
	sxu32 n = 0;
	for(;;){
		if( n >= SX_ARRAYSIZE(aLangConstruct) ){
			break;
		}
		if( aLangConstruct[n].nID == nKeywordID ){
			/* Return a pointer to the handler.
			*/
			return aLangConstruct[n].xConstruct;
		}
		n++;
	}
	/* Not a language construct */
	return 0;
}